

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * cmCTest::SafeBuildIdField(string *__return_storage_ptr__,string *value)

{
  long lVar1;
  char replace [2];
  char local_2a [2];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  if (__return_storage_ptr__->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x77d34c);
    if (lVar1 != -1) {
      local_2a[1] = 0;
      for (lVar1 = 0; lVar1 != 0xd; lVar1 = lVar1 + 1) {
        local_2a[0] = "\\:*?\"<>|\n\r\t\f\v"[lVar1];
        cmsys::SystemTools::ReplaceString(__return_storage_ptr__,local_2a,"");
      }
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::SafeBuildIdField(const std::string& value)
{
  std::string safevalue(value);

  if (!safevalue.empty()) {
    // Disallow non-filename and non-space whitespace characters.
    // If they occur, replace them with ""
    //
    const char* disallowed = "\\:*?\"<>|\n\r\t\f\v";

    if (safevalue.find_first_of(disallowed) != std::string::npos) {
      std::string::size_type i = 0;
      std::string::size_type n = strlen(disallowed);
      char replace[2];
      replace[1] = 0;

      for (i = 0; i < n; ++i) {
        replace[0] = disallowed[i];
        cmSystemTools::ReplaceString(safevalue, replace, "");
      }
    }
  }

  if (safevalue.empty()) {
    safevalue = "(empty)";
  }

  return safevalue;
}